

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name,
          vector<float,_std::allocator<float>_> *values_,VolumeMesh *mesh_,DataType dataType_)

{
  VolumeMesh *in_RCX;
  string *in_RSI;
  undefined8 *in_RDI;
  allocator local_69;
  string local_68 [4];
  DataType in_stack_ffffffffffffff9c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  VolumeMesh *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  VolumeMeshScalarQuantity *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"vertex",&local_69);
  VolumeMeshScalarQuantity::VolumeMeshScalarQuantity
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  *in_RDI = &PTR__VolumeMeshVertexScalarQuantity_0098ed78;
  in_RDI[0x34] = &DAT_0098ee18;
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4d8e97);
  *(undefined4 *)(in_RDI + 0x94) = 0;
  *(undefined1 *)((long)in_RDI + 0x4a4) = 0;
  in_RDI[0x95] = in_RDI;
  VolumeMesh::refreshVolumeMeshListeners(in_RCX);
  return;
}

Assistant:

VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity(std::string name, const std::vector<float>& values_,
                                                               VolumeMesh& mesh_, DataType dataType_)
    : VolumeMeshScalarQuantity(name, mesh_, "vertex", values_, dataType_), levelSetValue(0), isDrawingLevelSet(false),
      showQuantity(this)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}